

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O1

void __thiscall glslang::TInputScanner::setFile(TInputScanner *this,char *filename,int i)

{
  int iVar1;
  TPoolAllocator *this_00;
  TString *this_01;
  pool_allocator<char> local_28;
  
  this_00 = GetThreadPoolAllocator();
  this_01 = (TString *)TPoolAllocator::allocate(this_00,0x28);
  local_28.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)this_01,
             filename,&local_28);
  iVar1 = this->numSources + -1;
  if (this->currentSource <= iVar1) {
    iVar1 = this->currentSource;
  }
  if (iVar1 == i) {
    (this->logicalSourceLoc).name = this_01;
  }
  this->loc[i].name = this_01;
  return;
}

Assistant:

void setFile(const char* filename, int i)
    {
        TString* fn_tstr = NewPoolTString(filename);
        if (i == getLastValidSourceIndex()) {
            logicalSourceLoc.name = fn_tstr;
        }
        loc[i].name = fn_tstr;
    }